

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

int stb_vorbis_get_frame_float(stb_vorbis *f,int *channels,float ***output)

{
  int iVar1;
  int iVar2;
  long lVar3;
  int left;
  int right;
  int local_2c;
  int local_28;
  int local_24;
  
  iVar2 = vorbis_decode_packet(f,&local_24,&local_2c,&local_28);
  if (iVar2 == 0) {
    f->channel_buffer_start = 0;
    f->channel_buffer_end = 0;
    iVar2 = 0;
  }
  else {
    iVar2 = vorbis_finish_frame(f,local_24,local_2c,local_28);
    iVar1 = f->channels;
    if (0 < (long)iVar1) {
      lVar3 = 0;
      do {
        f->outputs[lVar3] = f->channel_buffers[lVar3] + local_2c;
        lVar3 = lVar3 + 1;
      } while (iVar1 != lVar3);
    }
    f->channel_buffer_start = local_2c;
    f->channel_buffer_end = local_2c + iVar2;
    if (channels != (int *)0x0) {
      *channels = iVar1;
    }
    if (output != (float ***)0x0) {
      *output = f->outputs;
    }
  }
  return iVar2;
}

Assistant:

int stb_vorbis_get_frame_float(stb_vorbis *f, int *channels, float ***output)
{
   int len, right,left,i;
   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      f->channel_buffer_start = f->channel_buffer_end = 0;
      return 0;
   }

   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   f->channel_buffer_start = left;
   f->channel_buffer_end   = left+len;

   if (channels) *channels = f->channels;
   if (output)   *output = f->outputs;
   return len;
}